

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcScorr.c
# Opt level: O0

int Abc_NtkTestScorrWriteEquivPair
              (Abc_Ntk_t *pNetlist,Vec_Int_t *vId2Name,int Id1,int Id2,FILE *pFile,int fPol)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pName2;
  char *pName1;
  int fPol_local;
  FILE *pFile_local;
  int Id2_local;
  int Id1_local;
  Vec_Int_t *vId2Name_local;
  Abc_Ntk_t *pNetlist_local;
  
  pcVar1 = Abc_NtkTestScorrGetName(pNetlist,vId2Name,Id1);
  pcVar2 = Abc_NtkTestScorrGetName(pNetlist,vId2Name,Id2);
  if ((pcVar1 == (char *)0x0) || (pcVar2 == (char *)0x0)) {
    pNetlist_local._4_4_ = 0;
  }
  else {
    pcVar3 = "";
    if (fPol != 0) {
      pcVar3 = "~";
    }
    fprintf((FILE *)pFile,"%s=%s%s\n",pcVar1,pcVar3,pcVar2);
    pNetlist_local._4_4_ = 1;
  }
  return pNetlist_local._4_4_;
}

Assistant:

int Abc_NtkTestScorrWriteEquivPair( Abc_Ntk_t * pNetlist, Vec_Int_t * vId2Name, int Id1, int Id2, FILE * pFile, int fPol )
{
    char * pName1 = Abc_NtkTestScorrGetName( pNetlist, vId2Name, Id1 );
    char * pName2 = Abc_NtkTestScorrGetName( pNetlist, vId2Name, Id2 );
    if ( pName1 == NULL || pName2 == NULL )
        return 0;
    fprintf( pFile, "%s=%s%s\n", pName1, fPol? "~": "", pName2 );
    return 1;
}